

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::SSLTest_ECHServerConfigsWithoutRetryConfigs_Test::TestBody
          (SSLTest_ECHServerConfigsWithoutRetryConfigs_Test *this)

{
  int iVar1;
  EVP_HPKE_KEM *kem;
  SSL_METHOD *meth;
  pointer *__ptr;
  char *in_R9;
  char *expected_predicate_value;
  pointer *__ptr_2;
  AssertionResult gtest_ar_;
  UniquePtr<SSL_CTX> ctx;
  UniquePtr<SSL_ECH_KEYS> keys;
  uint8_t *ech_config;
  UniquePtr<uint8_t> free_ech_config;
  size_t ech_config_len;
  ScopedEVP_HPKE_KEY key;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e8;
  internal local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  AssertHelper local_d0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  string local_c0;
  _Head_base<0UL,_ssl_ech_keys_st_*,_false> local_a0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  AssertHelper local_88;
  EVP_HPKE_KEY local_80;
  
  EVP_HPKE_KEY_zero(&local_80);
  kem = EVP_hpke_x25519_hkdf_sha256();
  iVar1 = EVP_HPKE_KEY_generate(&local_80,kem);
  local_e0[0] = (internal)(iVar1 != 0);
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c0,local_e0,
               (AssertionResult *)"EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256())",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x7ff,local_c0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    expected_predicate_value = (char *)0x10;
    iVar1 = SSL_marshal_ech_config
                      ((uint8_t **)&local_98,(size_t *)&local_88,'\x01',&local_80,"public.example",
                       0x10);
    local_e0[0] = (internal)(iVar1 != 0);
    local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_e0[0]) {
      local_90._M_head_impl = local_98._M_head_impl;
      local_a0._M_head_impl = SSL_ECH_KEYS_new();
      local_e0[0] = (internal)(local_a0._M_head_impl != (SSL_ECH_KEYS *)0x0);
      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_a0._M_head_impl == (SSL_ECH_KEYS *)0x0) {
        testing::Message::Message((Message *)&local_c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_c0,local_e0,(AssertionResult *)0x3467d1,"false","true",
                   expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x809,local_c0._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_c8);
LAB_00166841:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((SSL_CTX *)local_c8._M_head_impl != (SSL_CTX *)0x0) {
          (**(code **)(*(long *)local_c8._M_head_impl + 8))();
        }
        if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d8,local_d8);
        }
      }
      else {
        iVar1 = SSL_ECH_KEYS_add(local_a0._M_head_impl,0,(uint8_t *)local_98._M_head_impl,
                                 (size_t)local_88.data_,&local_80);
        local_e0[0] = (internal)(iVar1 != 0);
        local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_c8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_c0,local_e0,
                     (AssertionResult *)
                     "SSL_ECH_KEYS_add(keys.get(), 0, ech_config, ech_config_len, key.get())",
                     "false","true",expected_predicate_value);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_e8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x80b,local_c0._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_c8)
          ;
          goto LAB_00166841;
        }
        meth = (SSL_METHOD *)TLS_method();
        local_c8._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             SSL_CTX_new(meth);
        local_e0[0] = (internal)((SSL_CTX *)local_c8._M_head_impl != (SSL_CTX *)0x0);
        local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((SSL_CTX *)local_c8._M_head_impl == (SSL_CTX *)0x0) {
          testing::Message::Message((Message *)&local_e8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_c0,local_e0,(AssertionResult *)0x3442d9,"false","true",
                     expected_predicate_value);
          testing::internal::AssertHelper::AssertHelper
                    (&local_d0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x80f,local_c0._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_e8);
LAB_0016694d:
          testing::internal::AssertHelper::~AssertHelper(&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          if (local_e8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_e8._M_head_impl + 8))();
          }
        }
        else {
          iVar1 = SSL_CTX_set1_ech_keys((SSL_CTX *)local_c8._M_head_impl,local_a0._M_head_impl);
          local_e0[0] = (internal)(iVar1 == 0);
          local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!(bool)local_e0[0]) {
            testing::Message::Message((Message *)&local_e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_c0,local_e0,
                       (AssertionResult *)"SSL_CTX_set1_ech_keys(ctx.get(), keys.get())","true",
                       "false",expected_predicate_value);
            testing::internal::AssertHelper::AssertHelper
                      (&local_d0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x810,local_c0._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_e8);
            testing::internal::AssertHelper::~AssertHelper(&local_d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            if (local_e8._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_e8._M_head_impl + 8))();
            }
          }
          if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_d8,local_d8);
          }
          iVar1 = SSL_ECH_KEYS_add(local_a0._M_head_impl,1,(uint8_t *)local_98._M_head_impl,
                                   (size_t)local_88.data_,&local_80);
          local_e0[0] = (internal)(iVar1 != 0);
          local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_c0,local_e0,
                       (AssertionResult *)
                       "SSL_ECH_KEYS_add(keys.get(), 1, ech_config, ech_config_len, key.get())",
                       "false","true",expected_predicate_value);
            testing::internal::AssertHelper::AssertHelper
                      (&local_d0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x815,local_c0._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_e8);
            goto LAB_0016694d;
          }
          iVar1 = SSL_CTX_set1_ech_keys((SSL_CTX *)local_c8._M_head_impl,local_a0._M_head_impl);
          local_e0[0] = (internal)(iVar1 != 0);
          local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!(bool)local_e0[0]) {
            testing::Message::Message((Message *)&local_e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_c0,local_e0,
                       (AssertionResult *)"SSL_CTX_set1_ech_keys(ctx.get(), keys.get())","false",
                       "true",expected_predicate_value);
            testing::internal::AssertHelper::AssertHelper
                      (&local_d0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x816,local_c0._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_e8);
            goto LAB_0016694d;
          }
        }
        if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d8,local_d8);
        }
        std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_c8);
      }
      std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&local_a0);
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_90);
      goto LAB_001669b1;
    }
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c0,local_e0,
               (AssertionResult *)
               "SSL_marshal_ech_config(&ech_config, &ech_config_len, 1, key.get(), \"public.example\", 16)"
               ,"false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x804,local_c0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    local_98._M_head_impl = local_90._M_head_impl;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      local_98._M_head_impl = local_90._M_head_impl;
    }
  }
  if (local_98._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_98._M_head_impl + 8))();
  }
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
LAB_001669b1:
  EVP_HPKE_KEY_cleanup(&local_80);
  return;
}

Assistant:

TEST(SSLTest, ECHServerConfigsWithoutRetryConfigs) {
  bssl::ScopedEVP_HPKE_KEY key;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()));
  uint8_t *ech_config;
  size_t ech_config_len;
  ASSERT_TRUE(SSL_marshal_ech_config(&ech_config, &ech_config_len,
                                     /*config_id=*/1, key.get(),
                                     "public.example", 16));
  bssl::UniquePtr<uint8_t> free_ech_config(ech_config);

  // Install a non-retry config.
  bssl::UniquePtr<SSL_ECH_KEYS> keys(SSL_ECH_KEYS_new());
  ASSERT_TRUE(keys);
  ASSERT_TRUE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/0, ech_config,
                               ech_config_len, key.get()));

  // |keys| has no retry configs.
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);
  EXPECT_FALSE(SSL_CTX_set1_ech_keys(ctx.get(), keys.get()));

  // Add the same ECHConfig to the list, but this time mark it as a retry
  // config.
  ASSERT_TRUE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1, ech_config,
                               ech_config_len, key.get()));
  EXPECT_TRUE(SSL_CTX_set1_ech_keys(ctx.get(), keys.get()));
}